

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeLockCarefully(Btree *p)

{
  int iVar1;
  Btree *local_18;
  Btree *pLater;
  Btree *p_local;
  
  iVar1 = sqlite3_mutex_try(p->pBt->mutex);
  if (iVar1 == 0) {
    p->pBt->db = p->db;
    p->locked = '\x01';
  }
  else {
    for (local_18 = p->pNext; local_18 != (Btree *)0x0; local_18 = local_18->pNext) {
      if (local_18->locked != '\0') {
        unlockBtreeMutex(local_18);
      }
    }
    lockBtreeMutex(p);
    for (local_18 = p->pNext; local_18 != (Btree *)0x0; local_18 = local_18->pNext) {
      if (local_18->wantToLock != 0) {
        lockBtreeMutex(local_18);
      }
    }
  }
  return;
}

Assistant:

static void SQLITE_NOINLINE btreeLockCarefully(Btree *p){
  Btree *pLater;

  /* In most cases, we should be able to acquire the lock we
  ** want without having to go through the ascending lock
  ** procedure that follows.  Just be sure not to block.
  */
  if( sqlite3_mutex_try(p->pBt->mutex)==SQLITE_OK ){
    p->pBt->db = p->db;
    p->locked = 1;
    return;
  }

  /* To avoid deadlock, first release all locks with a larger
  ** BtShared address.  Then acquire our lock.  Then reacquire
  ** the other BtShared locks that we used to hold in ascending
  ** order.
  */
  for(pLater=p->pNext; pLater; pLater=pLater->pNext){
    assert( pLater->sharable );
    assert( pLater->pNext==0 || pLater->pNext->pBt>pLater->pBt );
    assert( !pLater->locked || pLater->wantToLock>0 );
    if( pLater->locked ){
      unlockBtreeMutex(pLater);
    }
  }
  lockBtreeMutex(p);
  for(pLater=p->pNext; pLater; pLater=pLater->pNext){
    if( pLater->wantToLock ){
      lockBtreeMutex(pLater);
    }
  }
}